

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char16_t_*>
fmt::v8::detail::format_decimal<char16_t,unsigned_int>(char16_t *out,uint value,int size)

{
  format_decimal_result<char16_t_*> fVar1;
  int iVar2;
  char *pcVar3;
  char16_t *end;
  int size_local;
  uint value_local;
  char16_t *out_local;
  
  iVar2 = count_digits(value);
  if (iVar2 <= size) {
    _size_local = out + size;
    for (end._4_4_ = value; 99 < end._4_4_; end._4_4_ = end._4_4_ / 100) {
      pcVar3 = digits2((ulong)end._4_4_ % 100);
      _size_local[-2] = (short)*pcVar3;
      _size_local[-1] = (short)pcVar3[1];
      _size_local = _size_local + -2;
    }
    if (end._4_4_ < 10) {
      out_local = _size_local + -1;
      _size_local[-1] = (short)end._4_4_ + L'0';
    }
    else {
      out_local = _size_local + -2;
      pcVar3 = digits2((ulong)end._4_4_);
      *out_local = (short)*pcVar3;
      _size_local[-1] = (short)pcVar3[1];
    }
    fVar1.end = out + size;
    fVar1.begin = out_local;
    return fVar1;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x45e,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}